

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O1

int __thiscall Clasp::AcyclicityCheck::init(AcyclicityCheck *this,EVP_PKEY_CTX *ctx)

{
  iterator pos;
  uint uVar1;
  DependencyGraph *in_RAX;
  long lVar2;
  long *plVar3;
  Parent local_28;
  
  if (this->graph_ == (DependencyGraph *)0x0) {
    in_RAX = (DependencyGraph *)(*(ulong *)(*(long *)(ctx + 0x68) + 0x10) & 0xfffffffffffffffe);
    this->graph_ = in_RAX;
  }
  if (this->graph_ != (DependencyGraph *)0x0) {
    if ((this->strat_ & 4) != 0) {
      plVar3 = (long *)(*(ulong *)(*(long *)(ctx + 0x68) + 0xe0) & 0xfffffffffffffffe);
      lVar2 = (**(code **)(*plVar3 + 0x30))(plVar3,*(ulong *)(ctx + 0x70) >> 0x3a);
      uVar1 = 6;
      if ((*(uint *)(lVar2 + 0x18) >> 0x14 & 1) == 0) {
        uVar1 = (*(uint *)(lVar2 + 0x18) & 0xc0000) == 0x40000 | 4;
      }
      this->strat_ = uVar1;
    }
    pos = (this->tags_).ebo_.buf;
    uVar1 = this->graph_->maxNode_;
    local_28 = (Parent)&this->tagCnt_;
    this->tagCnt_ = 0;
    (this->tags_).ebo_.size = 0;
    bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::
    insert_impl<unsigned_int,bk_lib::detail::Fill<unsigned_int>>
              ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)&this->tags_,pos,uVar1,
               (Fill<unsigned_int> *)&local_28);
    local_28.lit.rep_ = 0;
    local_28.node = 0;
    bk_lib::
    pod_vector<Clasp::AcyclicityCheck::Parent,_std::allocator<Clasp::AcyclicityCheck::Parent>_>::
    resize(&this->parent_,this->graph_->maxNode_,&local_28);
    (this->todo_).vec.ebo_.size = 0;
    (this->todo_).qFront = 0;
    this->solver_ = (Solver *)ctx;
    in_RAX = (DependencyGraph *)
             ExtDepGraph::attach(this->graph_,(Solver *)ctx,(Constraint *)this,this->genId_);
    this->genId_ = (uint64)in_RAX;
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
}

Assistant:

bool AcyclicityCheck::init(Solver& s) {
	if (!graph_) { graph_ = s.sharedContext()->extGraph.get(); }
	if (!graph_) { return true; }
	if (test_bit(strat_, config_bit)) {
		setStrategy(s.sharedContext()->configuration()->solver(s.id()));
	}
	tags_.assign(graph_->nodes(), tagCnt_ = 0);
	parent_.resize(graph_->nodes());
	todo_.clear();
	solver_ = &s;
	genId_  = graph_->attach(s, *this, genId_);
	return true;
}